

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O1

void helicsMessageFree(HelicsMessage message)

{
  HelicsMessage pvVar1;
  
  pvVar1 = (HelicsMessage)0x0;
  if ((message != (HelicsMessage)0x0) && (*(short *)((long)message + 10) == 0xb3)) {
    pvVar1 = message;
  }
  if ((pvVar1 != (HelicsMessage)0x0) &&
     (*(MessageHolder **)((long)pvVar1 + 0xf8) != (MessageHolder *)0x0)) {
    helics::MessageHolder::freeMessage
              (*(MessageHolder **)((long)pvVar1 + 0xf8),*(int *)((long)pvVar1 + 0xf0));
    return;
  }
  return;
}

Assistant:

void helicsMessageFree(HelicsMessage message)
{
    auto* mess = getMessageObj(message, nullptr);
    if (mess == nullptr) {
        return;
    }
    auto* messages = reinterpret_cast<helics::MessageHolder*>(mess->backReference);
    if (messages == nullptr) {
        return;
    }
    messages->freeMessage(mess->counter);
}